

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcDec.c
# Opt level: O0

int Bdc_ManNodeVerify(Bdc_Man_t *p,Bdc_Isf_t *pIsf,Bdc_Fun_t *pFunc)

{
  uint *pOut;
  int iVar1;
  Bdc_Fun_t *pBVar2;
  uint *puTruth;
  Bdc_Fun_t *pFunc_local;
  Bdc_Isf_t *pIsf_local;
  Bdc_Man_t *p_local;
  
  pOut = p->puTemp1;
  iVar1 = Bdc_IsComplement(pFunc);
  if (iVar1 == 0) {
    Kit_TruthCopy(pOut,pFunc->puFunc,p->nVars);
  }
  else {
    pBVar2 = Bdc_Regular(pFunc);
    Kit_TruthNot(pOut,pBVar2->puFunc,p->nVars);
  }
  iVar1 = Bdc_TableCheckContainment(p,pIsf,pOut);
  return iVar1;
}

Assistant:

int Bdc_ManNodeVerify( Bdc_Man_t * p, Bdc_Isf_t * pIsf, Bdc_Fun_t * pFunc )
{
    unsigned * puTruth = p->puTemp1;
    if ( Bdc_IsComplement(pFunc) )
        Kit_TruthNot( puTruth, Bdc_Regular(pFunc)->puFunc, p->nVars );
    else
        Kit_TruthCopy( puTruth, pFunc->puFunc, p->nVars );
    return Bdc_TableCheckContainment( p, pIsf, puTruth );
}